

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

MockExpectedCall * __thiscall
MockSupport::expectNCalls(MockSupport *this,uint amount,SimpleString *functionName)

{
  MockCheckedExpectedCall *this_00;
  SimpleString SVar1;
  undefined1 local_50 [40];
  MockCheckedExpectedCall *call;
  SimpleString *functionName_local;
  MockSupport *pMStack_18;
  uint amount_local;
  MockSupport *this_local;
  
  call = (MockCheckedExpectedCall *)functionName;
  functionName_local._4_4_ = amount;
  pMStack_18 = this;
  if ((this->enabled_ & 1U) == 0) {
    this_local = (MockSupport *)MockIgnoredExpectedCall::instance();
  }
  else {
    countCheck(this);
    this_00 = (MockCheckedExpectedCall *)
              operator_new(0xa0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockSupport.cpp"
                           ,0xae);
    MockCheckedExpectedCall::MockCheckedExpectedCall(this_00,functionName_local._4_4_);
    local_50._32_8_ = this_00;
    SVar1 = appendScopeToName((MockSupport *)local_50,(SimpleString *)this);
    (*(this_00->super_MockExpectedCall)._vptr_MockExpectedCall[2])
              (this_00,(MockSupport *)local_50,SVar1.bufferSize_);
    SimpleString::~SimpleString((SimpleString *)local_50);
    if ((this->strictOrdering_ & 1U) != 0) {
      (*((MockExpectedCall *)local_50._32_8_)->_vptr_MockExpectedCall[4])
                (local_50._32_8_,(ulong)(this->expectedCallOrder_ + 1),
                 (ulong)(this->expectedCallOrder_ + functionName_local._4_4_));
      this->expectedCallOrder_ = functionName_local._4_4_ + this->expectedCallOrder_;
    }
    MockExpectedCallsList::addExpectedCall
              (&this->expectations_,(MockCheckedExpectedCall *)local_50._32_8_);
    this_local = (MockSupport *)local_50._32_8_;
  }
  return (MockExpectedCall *)this_local;
}

Assistant:

MockExpectedCall& MockSupport::expectNCalls(unsigned int amount, const SimpleString& functionName)
{
    if (!enabled_) return MockIgnoredExpectedCall::instance();

    countCheck();

    MockCheckedExpectedCall* call = new MockCheckedExpectedCall(amount);
    call->withName(appendScopeToName(functionName));
    if (strictOrdering_) {
        call->withCallOrder(expectedCallOrder_ + 1, expectedCallOrder_ + amount);
        expectedCallOrder_ += amount;
    }
    expectations_.addExpectedCall(call);
    return *call;
}